

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh.c
# Opt level: O0

nsh_t * nsh_init(nsh_t *__return_storage_ptr__,nsh_status_t *status)

{
  nsh_t *nsh;
  nsh_status_t *status_local;
  
  memset(__return_storage_ptr__,0,0xba0);
  nsh_cmd_array_init(&__return_storage_ptr__->cmds);
  nsh_line_buffer_reset(&__return_storage_ptr__->line);
  nsh_history_reset(&__return_storage_ptr__->history);
  __return_storage_ptr__->current_history_entry = 0xffffffff;
  nsh_register_command(__return_storage_ptr__,"help",cmd_builtin_help);
  nsh_register_command(__return_storage_ptr__,"exit",cmd_builtin_exit);
  nsh_register_command(__return_storage_ptr__,"version",cmd_builtin_version);
  *status = NSH_STATUS_OK;
  return __return_storage_ptr__;
}

Assistant:

nsh_t nsh_init(nsh_status_t* status)
{
    nsh_t nsh = { 0 };

    nsh_cmd_array_init(&nsh.cmds);

    nsh_line_buffer_reset(&nsh.line);

#if NSH_FEATURE_USE_HISTORY == 1
    nsh_history_reset(&nsh.history);
    nsh.current_history_entry = NSH_HISTORY_INVALID_ENTRY;
#endif

    nsh_register_command(&nsh, "help", cmd_builtin_help);
    nsh_register_command(&nsh, "exit", cmd_builtin_exit);
    nsh_register_command(&nsh, "version", cmd_builtin_version);

    *status = NSH_STATUS_OK;

    return nsh;
}